

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool remap_generic(Compiler *compiler,SmallVector<spirv_cross::Resource,_8UL> *resources,
                  Remap *remap)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  Resource *pRVar4;
  Resource *__it;
  Resource *__it_00;
  Resource *__it_01;
  Remap *local_38;
  
  __it_00 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
  sVar1 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  pRVar4 = __it_00 + sVar1;
  lVar3 = (long)sVar1 >> 2;
  __it_01 = __it_00;
  local_38 = remap;
  if (0 < lVar3) {
    __it_01 = __it_00 + lVar3 * 4;
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
              ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                            *)&local_38,__it_00);
      __it = __it_00;
      if (bVar2) goto LAB_00116c8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
              ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                            *)&local_38,__it_00 + 1);
      __it = __it_00 + 1;
      if (bVar2) goto LAB_00116c8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
              ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                            *)&local_38,__it_00 + 2);
      __it = __it_00 + 2;
      if (bVar2) goto LAB_00116c8b;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
              ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                            *)&local_38,__it_00 + 3);
      __it = __it_00 + 3;
      if (bVar2) goto LAB_00116c8b;
      __it_00 = __it_00 + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = ((long)pRVar4 - (long)__it_01 >> 4) * -0x5555555555555555;
  if (lVar3 != 1) {
    __it = __it_01;
    if (lVar3 != 2) {
      __it = pRVar4;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
                  ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                                *)&local_38,__it_01), __it = __it_01, bVar2)) goto LAB_00116c8b;
      __it = __it_01 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
            ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                          *)&local_38,__it);
    if (bVar2) goto LAB_00116c8b;
    __it_01 = __it + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::$_0>
          ::operator()((_Iter_pred<remap_generic(spirv_cross::Compiler&,spirv_cross::SmallVector<spirv_cross::Resource,8ul>const&,Remap_const&)::__0>
                        *)&local_38,__it_01);
  __it = __it_01;
  if (!bVar2) {
    __it = pRVar4;
  }
LAB_00116c8b:
  if (__it != pRVar4) {
    spirv_cross::Compiler::set_remapped_variable_state(compiler,(VariableID)(__it->id).id,true);
    spirv_cross::Compiler::set_name(compiler,(ID)(__it->id).id,&remap->dst_name);
    spirv_cross::Compiler::set_subpass_input_remapped_components
              (compiler,(VariableID)(__it->id).id,remap->components);
  }
  return __it != pRVar4;
}

Assistant:

static bool remap_generic(Compiler &compiler, const SmallVector<Resource> &resources, const Remap &remap)
{
	auto itr =
	    find_if(begin(resources), end(resources), [&remap](const Resource &res) { return res.name == remap.src_name; });

	if (itr != end(resources))
	{
		compiler.set_remapped_variable_state(itr->id, true);
		compiler.set_name(itr->id, remap.dst_name);
		compiler.set_subpass_input_remapped_components(itr->id, remap.components);
		return true;
	}
	else
		return false;
}